

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

void xmlXIncludeMergeEntity(void *payload,void *vdata,xmlChar *name)

{
  xmlXIncludeCtxtPtr ctxt_00;
  xmlDoc *doc_00;
  int iVar1;
  xmlEntityPtr pxVar2;
  xmlChar *pxVar3;
  xmlXIncludeCtxtPtr ctxt;
  xmlDocPtr doc;
  xmlEntityPtr prev;
  xmlEntityPtr ret;
  xmlXIncludeMergeDataPtr data;
  xmlEntityPtr ent;
  xmlChar *name_local;
  void *vdata_local;
  void *payload_local;
  
  if (payload == (void *)0x0) {
    return;
  }
  if (vdata == (void *)0x0) {
    return;
  }
  ctxt_00 = *(xmlXIncludeCtxtPtr *)((long)vdata + 8);
  doc_00 = *vdata;
  if (ctxt_00 == (xmlXIncludeCtxtPtr)0x0) {
    return;
  }
  if (doc_00 == (xmlDoc *)0x0) {
    return;
  }
  if ((2 < *(int *)((long)payload + 0x5c) - 1U) && (*(int *)((long)payload + 0x5c) - 4U < 3)) {
    return;
  }
  pxVar2 = xmlGetDocEntity(doc_00,*(xmlChar **)((long)payload + 0x10));
  if (pxVar2 == (xmlEntityPtr)0x0) {
    pxVar2 = xmlAddDocEntity(doc_00,*(xmlChar **)((long)payload + 0x10),
                             *(int *)((long)payload + 0x5c),*(xmlChar **)((long)payload + 0x60),
                             *(xmlChar **)((long)payload + 0x68),*(xmlChar **)((long)payload + 0x50)
                            );
    if (pxVar2 == (xmlEntityPtr)0x0) {
      xmlXIncludeErrMemory(ctxt_00);
      return;
    }
    if (*(long *)((long)payload + 0x78) == 0) {
      return;
    }
    pxVar3 = xmlStrdup(*(xmlChar **)((long)payload + 0x78));
    pxVar2->URI = pxVar3;
    if (pxVar2->URI != (xmlChar *)0x0) {
      return;
    }
    xmlXIncludeErrMemory(ctxt_00);
    return;
  }
  if (*(xmlEntityType *)((long)payload + 0x5c) == pxVar2->etype) {
    if ((*(long *)((long)payload + 0x68) == 0) || (pxVar2->SystemID == (xmlChar *)0x0)) {
      if ((*(long *)((long)payload + 0x60) == 0) || (pxVar2->ExternalID == (xmlChar *)0x0)) {
        if ((*(long *)((long)payload + 0x50) == 0) || (pxVar2->content == (xmlChar *)0x0))
        goto LAB_0021fd1a;
        iVar1 = xmlStrEqual(*(xmlChar **)((long)payload + 0x50),pxVar2->content);
      }
      else {
        iVar1 = xmlStrEqual(*(xmlChar **)((long)payload + 0x60),pxVar2->ExternalID);
      }
    }
    else {
      iVar1 = xmlStrEqual(*(xmlChar **)((long)payload + 0x68),pxVar2->SystemID);
    }
    if (iVar1 != 0) {
      return;
    }
  }
LAB_0021fd1a:
  iVar1 = *(int *)((long)payload + 0x5c);
  if ((1 < iVar1 - 1U) && ((iVar1 == 3 || (2 < iVar1 - 4U)))) {
    xmlXIncludeErr(ctxt_00,(xmlNodePtr)payload,0x642,"mismatch in redefinition of entity %s\n",
                   *(xmlChar **)((long)payload + 0x10));
  }
  return;
}

Assistant:

static void
xmlXIncludeMergeEntity(void *payload, void *vdata,
	               const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlEntityPtr ent = (xmlEntityPtr) payload;
    xmlXIncludeMergeDataPtr data = (xmlXIncludeMergeDataPtr) vdata;
    xmlEntityPtr ret, prev;
    xmlDocPtr doc;
    xmlXIncludeCtxtPtr ctxt;

    if ((ent == NULL) || (data == NULL))
	return;
    ctxt = data->ctxt;
    doc = data->doc;
    if ((ctxt == NULL) || (doc == NULL))
	return;
    switch (ent->etype) {
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
        case XML_INTERNAL_PREDEFINED_ENTITY:
	    return;
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    break;
    }
    prev = xmlGetDocEntity(doc, ent->name);
    if (prev == NULL) {
        ret = xmlAddDocEntity(doc, ent->name, ent->etype, ent->ExternalID,
                              ent->SystemID, ent->content);
        if (ret == NULL) {
            xmlXIncludeErrMemory(ctxt);
            return;
        }
	if (ent->URI != NULL) {
	    ret->URI = xmlStrdup(ent->URI);
            if (ret->URI == 0)
                xmlXIncludeErrMemory(ctxt);
        }
    } else {
        if (ent->etype != prev->etype)
            goto error;

        if ((ent->SystemID != NULL) && (prev->SystemID != NULL)) {
            if (!xmlStrEqual(ent->SystemID, prev->SystemID))
                goto error;
        } else if ((ent->ExternalID != NULL) &&
                   (prev->ExternalID != NULL)) {
            if (!xmlStrEqual(ent->ExternalID, prev->ExternalID))
                goto error;
        } else if ((ent->content != NULL) && (prev->content != NULL)) {
            if (!xmlStrEqual(ent->content, prev->content))
                goto error;
        } else {
            goto error;
        }
    }
    return;
error:
    switch (ent->etype) {
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
        case XML_INTERNAL_PREDEFINED_ENTITY:
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
	    return;
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    break;
    }
    xmlXIncludeErr(ctxt, (xmlNodePtr) ent, XML_XINCLUDE_ENTITY_DEF_MISMATCH,
                   "mismatch in redefinition of entity %s\n",
		   ent->name);
}